

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void anon_unknown.dwarf_fff93::compressUncompress(unsigned_short *raw,int n)

{
  int iVar1;
  ostream *poVar2;
  char *compressed_00;
  unsigned_short *puVar3;
  Array<unsigned_short> *this;
  int in_ESI;
  long in_RDI;
  int i;
  int nCompressed;
  Array<unsigned_short> uncompressed;
  Array<char> compressed;
  int in_stack_000053ac;
  unsigned_short *in_stack_000053b0;
  int in_stack_000053bc;
  char *in_stack_000053c0;
  long in_stack_ffffffffffffff38;
  Array<unsigned_short> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  Array local_30 [16];
  Array local_20 [20];
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_2_5::Array<char>::Array((Array<char> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Imf_2_5::Array<unsigned_short>::Array(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar2 = std::operator<<((ostream *)&std::cout,"compressing ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  iVar1 = (int)((ulong)poVar2 >> 0x20);
  compressed_00 = Imf_2_5::Array::operator_cast_to_char_(local_20);
  iVar1 = Imf_2_5::hufCompress
                    ((unsigned_short *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                     ,iVar1,compressed_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"uncompressing ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Imf_2_5::Array::operator_cast_to_char_(local_20);
  Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
  Imf_2_5::hufUncompress(in_stack_000053c0,in_stack_000053bc,in_stack_000053b0,in_stack_000053ac);
  poVar2 = std::operator<<((ostream *)&std::cout,"comparing: ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  iVar4 = 0;
  while( true ) {
    if (local_c <= iVar4) {
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(long)local_c * 2);
      poVar2 = std::operator<<(poVar2," bytes, compressed ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      this = (Array<unsigned_short> *)std::operator<<(poVar2," bytes");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      Imf_2_5::Array<unsigned_short>::~Array(this);
      Imf_2_5::Array<char>::~Array((Array<char> *)this);
      return;
    }
    puVar3 = Imf_2_5::Array::operator_cast_to_unsigned_short_(local_30);
    if (puVar3[iVar4] != *(unsigned_short *)(local_8 + (long)iVar4 * 2)) break;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("uncompressed[i] == raw[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testHuf.cpp"
                ,0x81,"void (anonymous namespace)::compressUncompress(const unsigned short *, int)")
  ;
}

Assistant:

void
compressUncompress (const unsigned short raw[], int n)
{
    Array <char> compressed (3 * n + 4 * 65536);
    Array <unsigned short> uncompressed (n);

    cout << "compressing " << flush;

    int nCompressed = hufCompress (raw, n, compressed);

    cout << "uncompressing " << flush;

    hufUncompress (compressed, nCompressed, uncompressed, n);

    cout << "comparing: " << flush;

    for (int i = 0; i < n; ++i)
	assert (uncompressed[i] == raw[i]);

    cout << sizeof (raw[0]) * n << " bytes, compressed " <<
	    nCompressed  << " bytes" << endl;
}